

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GyroscopeSensor.cpp
# Opt level: O0

string * __thiscall iDynTree::GyroscopeSensor::getName_abi_cxx11_(GyroscopeSensor *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,*(string **)(in_RSI + 8));
  return in_RDI;
}

Assistant:

std::string GyroscopeSensor::getName() const
{
    return this->pimpl->name;
}